

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.c
# Opt level: O1

ZyanStatus ZyanStringAppendDecU(ZyanString *string,ZyanU64 value,ZyanU8 padding_length)

{
  ZyanUSize ZVar1;
  bool bVar2;
  ZyanStatus ZVar3;
  undefined1 *puVar4;
  ulong uVar5;
  undefined1 *puVar6;
  size_t __n;
  undefined1 *__n_00;
  undefined1 *puVar7;
  undefined2 uStack_36;
  undefined1 auStack_34 [4];
  
  if (string != (ZyanString *)0x0) {
    uVar5 = value;
    puVar7 = auStack_34;
    if (99 < value) {
      do {
        value = uVar5 / 100;
        *(undefined2 *)(puVar7 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (value * 0x7fffffffffffff9c + uVar5) * 2);
        puVar7 = puVar7 + -2;
        bVar2 = 9999 < uVar5;
        uVar5 = value;
      } while (bVar2);
    }
    *(undefined2 *)(puVar7 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + value * 2);
    __n_00 = auStack_34 + (-(ulong)(value < 10) - (long)(puVar7 + -2));
    puVar6 = (undefined1 *)(ulong)padding_length;
    puVar4 = puVar6;
    if (puVar6 < __n_00) {
      puVar4 = __n_00;
    }
    ZVar1 = (string->vector).size;
    puVar4 = puVar4 + ZVar1;
    if ((puVar4 <= (undefined1 *)(string->vector).capacity) ||
       (ZVar3 = ZyanStringResize(string,(ZyanUSize)(puVar4 + -1)), -1 < (int)ZVar3)) {
      __n = (long)puVar6 - (long)__n_00;
      if (puVar6 < __n_00 || __n == 0) {
        __n = 0;
      }
      else {
        memset((void *)((long)(string->vector).data + (ZVar1 - 1)),0x30,__n);
      }
      memcpy((void *)((long)(string->vector).data + __n + ZVar1 + -1),puVar7 + -2 + (value < 10),
             (size_t)__n_00);
      (string->vector).size = (ZyanUSize)puVar4;
      *(undefined1 *)((long)(string->vector).data + (long)(puVar4 + -1)) = 0;
      ZVar3 = 0x100000;
    }
    return ZVar3;
  }
  return 0x80100004;
}

Assistant:

ZyanStatus ZyanStringAppendDecU(ZyanString* string, ZyanU64 value, ZyanU8 padding_length)
{
#if defined(ZYAN_X64) || defined(ZYAN_AARCH64) || defined(ZYAN_PPC64) || defined(ZYAN_RISCV64) || defined(ZYAN_LOONGARCH)
    return ZyanStringAppendDecU64(string, value, padding_length);
#else
    // Working with 64-bit values is slow on non 64-bit systems
    if (value & 0xFFFFFFFF00000000)
    {
        return ZyanStringAppendDecU64(string, value, padding_length);
    }
    return ZyanStringAppendDecU32(string, (ZyanU32)value, padding_length);
#endif
}